

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

void __thiscall
Protocol::MQTT::V5::Property<Protocol::MQTT::Common::DynamicBinaryData>::~Property
          (Property<Protocol::MQTT::Common::DynamicBinaryData> *this)

{
  free(*(void **)&this->field_0x23);
  *(undefined2 *)&this->field_0x21 = 0;
  operator_delete(this);
  return;
}

Assistant:

struct Property<DynamicBinaryData> Final : public PropertyBase
            {
                /** The property value, depends on the type */
                DynamicBinaryData   value;

                /** This give the size required for serializing this property header in bytes */
                uint32 getSize() const { return sizeof(type) + value.getSize(); }
                /** Copy the value into the given buffer.
                    @param buffer   A pointer to an allocated buffer that's at least 1 byte long, and at worst very large (use getSize to figure out the required size).
                    @return The number of bytes used in the buffer */
                uint32 copyInto(uint8 * buffer) const { buffer[0] = type; uint32 o = value.copyInto(buffer+1); return o + 1; }
                /** Read the value from a buffer.
                    @param buffer   A pointer to an allocated buffer that's at least 1 byte long
                    @return The number of bytes read from the buffer, or BadData upon error */
                uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    if ((buffer[0] & 0x80) || buffer[0] != type) return BadData;
                    if (bufLength < 3) return NotEnoughData;
                    uint32 o = value.readFrom(buffer+1, bufLength - 1);
                    if (isError(o)) return o;
                    return o+1;
                }
#if MQTTAvoidValidation != 1
                /** Check if this property is valid */
                bool check() const { return type < 0x80 && value.check(); }
#endif
#if MQTTDumpCommunication == 1
                void dump(MQTTString & out, const int indent = 0)
                {
                    out += MQTTStringPrintf("%*sType %s\n", indent, "", PrivateRegistry::getPropertyName(type));
                    value.dump(out, indent + 2);
                }
#endif

                /** Clone this property */
                PropertyBase * clone() const { return new Property((PropertyType)type, value, true); }
                /** Accept a visitor for this type */
                bool acceptVisitor(VisitorVariant & visitor) const
                {
                    if (!PropertyBase::acceptVisitor(visitor)) return false;
                    DynamicBinDataView * view = visitor.as<DynamicBinDataView>();
                    if (!view) return false;
                    *view = value;
                    return true;
                }

                /** The default constructor */
                Property(const PropertyType type, const DynamicBinaryData value = 0, const bool heap = false) : PropertyBase(type, heap), value(value) {}
            }